

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::handleMessage
          (RunContext *this,AssertionInfo *info,OfType resultType,StringRef *message,
          AssertionReaction *reaction)

{
  char *pcVar1;
  size_type sVar2;
  char *pcVar3;
  size_t sVar4;
  size_type sVar5;
  bool bVar6;
  pointer pIVar7;
  undefined1 local_158 [8];
  AssertionResult assertionResult;
  string local_b8;
  LazyExpression local_98;
  undefined1 local_88 [8];
  AssertionResultData data;
  AssertionReaction *reaction_local;
  StringRef *message_local;
  OfType resultType_local;
  AssertionInfo *info_local;
  RunContext *this_local;
  
  data._80_8_ = reaction;
  pIVar7 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->(&this->m_reporter);
  (*pIVar7->_vptr_IStreamingReporter[0xd])();
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  pcVar1 = (info->macroName).m_start;
  sVar2 = (info->macroName).m_size;
  pcVar3 = (info->lineInfo).file;
  sVar4 = (info->lineInfo).line;
  sVar5 = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = sVar5;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar3;
  (this->m_lastAssertionInfo).lineInfo.line = sVar4;
  (this->m_lastAssertionInfo).macroName.m_start = pcVar1;
  (this->m_lastAssertionInfo).macroName.m_size = sVar2;
  LazyExpression::LazyExpression(&local_98,false);
  AssertionResultData::AssertionResultData((AssertionResultData *)local_88,resultType,&local_98);
  StringRef::operator_cast_to_string(&local_b8,message);
  std::__cxx11::string::operator=((string *)local_88,(string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  AssertionResult::AssertionResult
            ((AssertionResult *)local_158,&this->m_lastAssertionInfo,(AssertionResultData *)local_88
            );
  assertionEnded(this,(AssertionResult *)local_158);
  bVar6 = AssertionResult::isOk((AssertionResult *)local_158);
  if (!bVar6) {
    populateReaction(this,(AssertionReaction *)data._80_8_);
  }
  AssertionResult::~AssertionResult((AssertionResult *)local_158);
  AssertionResultData::~AssertionResultData((AssertionResultData *)local_88);
  return;
}

Assistant:

void RunContext::handleMessage(
            AssertionInfo const& info,
            ResultWas::OfType resultType,
            StringRef const& message,
            AssertionReaction& reaction
    ) {
        m_reporter->assertionStarting( info );

        m_lastAssertionInfo = info;

        AssertionResultData data( resultType, LazyExpression( false ) );
        data.message = static_cast<std::string>(message);
        AssertionResult assertionResult{ m_lastAssertionInfo, data };
        assertionEnded( assertionResult );
        if( !assertionResult.isOk() )
            populateReaction( reaction );
    }